

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O0

void verify_min_dfs(log_multi *b,node *node)

{
  uint32_t uVar1;
  ostream *this;
  log_multi *in_RSI;
  node *in_RDI;
  log_multi *unaff_retaddr;
  node *in_stack_ffffffffffffffc8;
  log_multi *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  uint32_t uVar2;
  
  if ((in_RSI->max_predictors & 0x100000000) != 0) {
    uVar2 = (uint32_t)in_RSI->max_predictors;
    uVar1 = min_left_right(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (uVar2 != uVar1) {
      this = std::operator<<((ostream *)&std::cout,"badness! ");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      v_array<node>::operator[]((v_array<node> *)&in_RDI->preds,0);
      display_tree_dfs(unaff_retaddr,in_RDI,(uint32_t)((ulong)in_RSI >> 0x20));
    }
    v_array<node>::operator[]
              ((v_array<node> *)&in_RDI->preds,(ulong)*(uint *)((long)&in_RSI->predictors_used + 4))
    ;
    verify_min_dfs(in_RSI,(node *)CONCAT44(uVar2,in_stack_ffffffffffffffe8));
    v_array<node>::operator[]((v_array<node> *)&in_RDI->preds,(ulong)*(uint *)&in_RSI->progress);
    verify_min_dfs(in_RSI,(node *)CONCAT44(uVar2,in_stack_ffffffffffffffe8));
  }
  return;
}

Assistant:

void verify_min_dfs(log_multi& b, const node& node)
{
  if (node.internal)
  {
    if (node.min_count != min_left_right(b, node))
    {
      cout << "badness! " << endl;
      display_tree_dfs(b, b.nodes[0], 0);
    }
    verify_min_dfs(b, b.nodes[node.left]);
    verify_min_dfs(b, b.nodes[node.right]);
  }
}